

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  uint32_t *ts_2;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  Variant *this_01;
  Types TVar1;
  ID id;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  size_t sVar3;
  Variant *pVVar4;
  uint *puVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  uint uVar11;
  ExecutionModel EVar12;
  SPIREntryPoint *pSVar13;
  SPIRConstant *pSVar14;
  SPIRConstantOp *constant;
  SPIRType *pSVar15;
  SPIRVariable *pSVar16;
  mapped_type *pmVar17;
  SpecializationConstant *pSVar18;
  CompilerError *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  byte bVar19;
  StorageClass SVar20;
  uint uVar21;
  CompilerGLSL *this_03;
  long lVar22;
  ID *__k;
  bool emitted;
  bool emitted_base_instance;
  ParsedIR *local_1b8;
  SPIREntryPoint *local_1b0;
  SpecializationConstant wg_y;
  SpecializationConstant wg_z;
  LoopLock loop_lock;
  SpecializationConstant wg_x;
  char *storage;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [16];
  
  pSVar13 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x39])(this);
  if ((pSVar13->model == ExecutionModelFragment) && (bVar8 = is_legacy(this), bVar8)) {
    replace_fragment_outputs(this);
  }
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    emit_pls(this);
  }
  EVar12 = pSVar13->model;
  if ((EVar12 - ExecutionModelTessellationControl < 3) || (EVar12 == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,EVar12);
  }
  if (((this->options).separate_shader_objects == true) && ((this->options).es == false)) {
    EVar12 = pSVar13->model;
    if (EVar12 - ExecutionModelTessellationControl < 3) {
      emit_declared_builtin_block(this,StorageClassInput,EVar12);
      goto LAB_0023faaa;
    }
    if (EVar12 != ExecutionModelVertex) {
      if (EVar12 == ExecutionModelFragment) goto LAB_0023f9ad;
      if (EVar12 != ExecutionModelMeshEXT) goto LAB_0023fabc;
    }
    SVar20 = StorageClassOutput;
  }
  else {
LAB_0023f9ad:
    bVar8 = should_force_emit_builtin_block(this,StorageClassOutput);
    if (bVar8) {
LAB_0023faaa:
      EVar12 = pSVar13->model;
      SVar20 = StorageClassOutput;
    }
    else {
      if (pSVar13->geometry_passthrough != true) {
        pcVar7 = "--pls-out";
        if (pSVar13->model == ExecutionModelFragment) {
          pcVar7 = "--pls-in";
        }
        storage = pcVar7 + 6;
        ts_2 = &(this->super_Compiler).clip_distance_count;
        if ((this->super_Compiler).clip_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,&storage,(char (*) [24])0x37a2dc,ts_2,(char (*) [3])0x381d96);
        }
        if ((this->super_Compiler).cull_distance_count == 0) {
          bVar8 = true;
        }
        else {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,&storage,(char (*) [24])0x37a2f5,
                     &(this->super_Compiler).cull_distance_count,(char (*) [3])0x381d96);
          bVar8 = (this->super_Compiler).cull_distance_count == 0;
        }
        if ((*ts_2 != 0) || (!bVar8)) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
        }
        goto LAB_0023fabc;
      }
      EVar12 = pSVar13->model;
      SVar20 = StorageClassInput;
    }
  }
  emit_declared_builtin_block(this,SVar20,EVar12);
LAB_0023fabc:
  local_1b0 = pSVar13;
  if ((this->super_Compiler).position_invariant == true) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
  }
  emitted = false;
  local_1b8 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_1b8);
  pTVar2 = (this->super_Compiler).ir.ids_for_constant_or_type.
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_Compiler).ir.ids_for_constant_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar22 = 0; sVar3 << 2 != lVar22; lVar22 = lVar22 + 4) {
    uVar11 = *(uint *)((long)&pTVar2->id + lVar22);
    pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
    this_01 = pVVar4 + uVar11;
    TVar1 = pVVar4[uVar11].type;
    if (TVar1 == TypeType) {
      pSVar15 = Variant::get<spirv_cross::SPIRType>(this_01);
      if (*(int *)&(pSVar15->super_IVariant).field_0xc == 0xf) {
        if ((((pSVar15->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
            (pSVar15->pointer != false)) ||
           (bVar8 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                               DecorationBlock), bVar8)) {
          bVar8 = false;
        }
        else {
          bVar8 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                             DecorationBufferBlock);
          bVar8 = !bVar8;
        }
        if (((*(int *)&(pSVar15->super_IVariant).field_0xc == 0xf) && (pSVar15->pointer == true)) &&
           ((bVar9 = Compiler::has_decoration
                               (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                                DecorationBlock), bVar9 &&
            ((uVar11 = pSVar15->storage - StorageClassRayPayloadKHR, uVar11 < 5 &&
             ((0x13U >> (uVar11 & 0x1f) & 1) != 0)))))) {
          pSVar15 = Compiler::get<spirv_cross::SPIRType>
                              (&this->super_Compiler,(pSVar15->parent_type).id);
        }
        else if (!bVar8) goto LAB_0023fc84;
        if (emitted == true) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
        }
        emitted = false;
        emit_struct(this,pSVar15);
      }
    }
    else if (TVar1 == TypeConstantOp) {
      constant = Variant::get<spirv_cross::SPIRConstantOp>(this_01);
      emit_specialization_constant_op(this,constant);
LAB_0023fbcc:
      emitted = true;
    }
    else if (TVar1 == TypeConstant) {
      pSVar14 = Variant::get<spirv_cross::SPIRConstant>(this_01);
      if ((pSVar14->specialization != false) || ((pSVar14->is_used_as_lut & 1U) != 0)) {
        if ((pSVar14->specialization != false) && ((this->options).vulkan_semantics == false)) {
          id.id = (pSVar14->super_IVariant).self.id;
          this_03 = (CompilerGLSL *)(ulong)id.id;
          uVar10 = Compiler::get_decoration(&this->super_Compiler,id,DecorationSpecId);
          constant_value_macro_name_abi_cxx11_((string *)&storage,this_03,uVar10);
          ::std::__cxx11::string::operator=
                    ((string *)&pSVar14->specialization_constant_macro_name,(string *)&storage);
          ::std::__cxx11::string::~string((string *)&storage);
        }
        emit_constant(this,pSVar14);
        goto LAB_0023fbcc;
      }
    }
LAB_0023fc84:
  }
  ParsedIR::LoopLock::~LoopLock(&loop_lock);
  if (emitted != false) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
  }
  if (((local_1b0->model == ExecutionModelGLCompute) && ((this->options).vulkan_semantics == false))
     && (((local_1b0->workgroup_size).constant != 0 ||
         (((local_1b0->flags).lower & 0x4000000000) != 0)))) {
    wg_x = (SpecializationConstant)((ulong)wg_x & 0xffffffff00000000);
    wg_y = (SpecializationConstant)((ulong)wg_y & 0xffffffff00000000);
    wg_z.id.id = 0;
    Compiler::get_work_group_size_specialization_constants(&this->super_Compiler,&wg_x,&wg_y,&wg_z);
    if (((wg_x.id.id != 0) || (wg_y.id.id != 0)) || (wg_z.id.id != 0)) {
      storage = local_138[0]._M_local_buf + 8;
      local_140 = 0;
      local_138[0]._M_allocated_capacity = 8;
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&storage,&wg_x,&wg_y,&wg_z);
      merge((string *)&loop_lock,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)&storage,", ");
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loop_lock,
                 (char (*) [6])0x378782);
      ::std::__cxx11::string::~string((string *)&loop_lock);
      statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)&storage);
    }
  }
  emitted = false;
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    puVar5 = (this->super_Compiler).physical_storage_non_block_pointer_types.
             super_VectorView<unsigned_int>.ptr;
    sVar3 = (this->super_Compiler).physical_storage_non_block_pointer_types.
            super_VectorView<unsigned_int>.buffer_size;
    for (lVar22 = 0; sVar3 << 2 != lVar22; lVar22 = lVar22 + 4) {
      emit_buffer_reference_block(this,*(uint32_t *)((long)puVar5 + lVar22),false);
    }
    ParsedIR::create_loop_hard_lock(local_1b8);
    pTVar2 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar3 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar22 = 0; sVar3 << 2 != lVar22; lVar22 = lVar22 + 4) {
      uVar11 = *(uint *)((long)&pTVar2->id + lVar22);
      if ((((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar11].type ==
            TypeType) &&
          (pSVar15 = ParsedIR::get<spirv_cross::SPIRType>(local_1b8,uVar11),
          *(int *)&(pSVar15->super_IVariant).field_0xc == 0xf)) &&
         ((pSVar15->pointer == true &&
          ((pSVar15->pointer_depth == 1 &&
           (bVar8 = Compiler::type_is_array_of_pointers(&this->super_Compiler,pSVar15),
           !bVar8 && pSVar15->storage == StorageClassPhysicalStorageBuffer)))))) {
        emit_buffer_reference_block(this,uVar11,true);
      }
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
    ParsedIR::create_loop_hard_lock(local_1b8);
    pTVar2 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar3 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar22 = 0; sVar3 << 2 != lVar22; lVar22 = lVar22 + 4) {
      uVar11 = *(uint *)((long)&pTVar2->id + lVar22);
      if (((((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar11].type
             == TypeType) &&
           (pSVar15 = ParsedIR::get<spirv_cross::SPIRType>(local_1b8,uVar11),
           *(int *)&(pSVar15->super_IVariant).field_0xc == 0xf)) && (pSVar15->pointer == true)) &&
         ((pSVar15->pointer_depth == 1 &&
          (bVar8 = Compiler::type_is_array_of_pointers(&this->super_Compiler,pSVar15),
          !bVar8 && pSVar15->storage == StorageClassPhysicalStorageBuffer)))) {
        emit_buffer_reference_block(this,uVar11,false);
      }
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  }
  ParsedIR::create_loop_hard_lock(local_1b8);
  pTVar2 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  this_00 = &(this->super_Compiler).ir.meta;
  local_1b0 = (SPIREntryPoint *)
              ((this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2);
  for (lVar22 = 0; local_1b0 != (SPIREntryPoint *)lVar22; lVar22 = lVar22 + 4) {
    uVar11 = *(uint *)((long)&pTVar2->id + lVar22);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar11].type ==
        TypeVariable) {
      pSVar16 = ParsedIR::get<spirv_cross::SPIRVariable>(local_1b8,uVar11);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar16->super_IVariant).field_0xc);
      SVar20 = pSVar15->storage;
      bVar19 = 1;
      if (((SVar20 != StorageClassUniform) && (SVar20 != StorageClassStorageBuffer)) &&
         (SVar20 != StorageClassShaderRecordBufferKHR)) {
        bVar19 = 0;
      }
      __k = &(pSVar15->super_IVariant).self;
      pmVar17 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,__k);
      if (((pmVar17->decoration).decoration_flags.lower & 4) == 0) {
        pmVar17 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,__k);
        bVar8 = ((pmVar17->decoration).decoration_flags.lower & 8) == 0;
      }
      else {
        bVar8 = false;
      }
      if (((pSVar16->storage != StorageClassFunction) && ((bVar19 & pSVar15->pointer) != 0)) &&
         (bVar9 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false),
         !bVar8 && !bVar9)) {
        (*(this->super_Compiler)._vptr_Compiler[0x20])(this,pSVar16);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  ParsedIR::create_loop_hard_lock(local_1b8);
  pTVar2 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar22 = 0; sVar3 << 2 != lVar22; lVar22 = lVar22 + 4) {
    uVar11 = *(uint *)((long)&pTVar2->id + lVar22);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar11].type ==
        TypeVariable) {
      pSVar16 = ParsedIR::get<spirv_cross::SPIRVariable>(local_1b8,uVar11);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar16->super_IVariant).field_0xc);
      if (((pSVar16->storage != StorageClassFunction) && (pSVar15->pointer == true)) &&
         ((pSVar15->storage == StorageClassPushConstant &&
          (bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false), !bVar8)))) {
        (*(this->super_Compiler)._vptr_Compiler[0x21])(this,pSVar16);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  sVar3 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  bVar8 = (this->options).vulkan_semantics;
  ParsedIR::create_loop_hard_lock(local_1b8);
  pTVar2 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar6 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar22 = 0; sVar6 << 2 != lVar22; lVar22 = lVar22 + 4) {
    uVar11 = *(uint *)((long)&pTVar2->id + lVar22);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar11].type ==
        TypeVariable) {
      pSVar16 = ParsedIR::get<spirv_cross::SPIRVariable>(local_1b8,uVar11);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar16->super_IVariant).field_0xc);
      if ((((bVar8 & sVar3 == 0) != 0) ||
          (uVar11 = *(uint *)&(pSVar15->super_IVariant).field_0xc, uVar21 = uVar11 ^ 0x10,
          (pSVar15->image).dim == DimBuffer && uVar21 == 0 ||
          uVar11 != 0x12 && ((pSVar15->image).sampled != 1 || uVar21 != 0))) &&
         ((pSVar16->storage != StorageClassFunction && (pSVar15->pointer == true)))) {
        SVar20 = pSVar15->storage;
        if (((((SVar20 - StorageClassCallableDataKHR < 0xf) &&
              ((0x4c03U >> (SVar20 - StorageClassCallableDataKHR & 0x1f) & 1) != 0)) ||
             (SVar20 == StorageClassAtomicCounter)) || (SVar20 == StorageClassUniformConstant)) &&
           (bVar9 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false), !bVar9)) {
          (*(this->super_Compiler)._vptr_Compiler[0x22])(this,pSVar16);
          emitted = true;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  if (emitted == true) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
  }
  lVar22 = 0;
  wg_x = (SpecializationConstant)&emitted;
  emitted = false;
  wg_y = (SpecializationConstant)&emitted_base_instance;
  emitted_base_instance = false;
  ParsedIR::create_loop_hard_lock(local_1b8);
  local_1b0 = (SPIREntryPoint *)
              (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  do {
    if (sVar3 << 2 == lVar22) {
      ParsedIR::LoopLock::~LoopLock(&loop_lock);
      local_1b0 = (SPIREntryPoint *)
                  (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
      local_1b8 = (ParsedIR *)
                  ((this->super_Compiler).global_variables.super_VectorView<unsigned_int>.
                   buffer_size << 2);
      for (lVar22 = 0; local_1b8 != (ParsedIR *)lVar22; lVar22 = lVar22 + 4) {
        pSVar16 = Compiler::get<spirv_cross::SPIRVariable>
                            (&this->super_Compiler,*(uint32_t *)((long)local_1b0 + lVar22));
        bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,true);
        if (!bVar8) {
          if (pSVar16->storage == StorageClassOutput) {
            uVar10 = (pSVar16->initializer).id;
            if ((uVar10 != 0) &&
               (pSVar14 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                                    (&this->super_Compiler,uVar10), pSVar14 != (SPIRConstant *)0x0))
            {
              emit_output_variable_initializer(this,pSVar16);
            }
          }
          else {
            bVar8 = variable_is_lut(this,pSVar16);
            if (!bVar8) {
              add_resource_name(this,(pSVar16->super_IVariant).self.id);
              storage = (char *)local_138;
              local_140 = 0;
              local_138[0]._M_allocated_capacity =
                   local_138[0]._M_allocated_capacity & 0xffffffffffffff00;
              if ((((this->options).force_zero_initialized_variables == true) &&
                  (pSVar16->storage == StorageClassPrivate)) &&
                 (((pSVar16->initializer).id == 0 && ((pSVar16->static_expression).id == 0)))) {
                pSVar15 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar16);
                bVar8 = type_can_zero_initialize(this,pSVar15);
                if (bVar8) {
                  uVar10 = Compiler::get_variable_data_type_id(&this->super_Compiler,pSVar16);
                  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (this->super_Compiler)._vptr_Compiler;
                  (**(code **)((long)&ts_1[0xd].field_2 + 8))(&wg_x,this,uVar10);
                  join<char_const(&)[4],std::__cxx11::string>
                            ((string *)&loop_lock,(spirv_cross *)0x395f16,(char (*) [4])&wg_x,ts_1);
                  ::std::__cxx11::string::operator=((string *)&storage,(string *)&loop_lock);
                  ::std::__cxx11::string::~string((string *)&loop_lock);
                  ::std::__cxx11::string::~string((string *)&wg_x);
                }
              }
              (*(this->super_Compiler)._vptr_Compiler[0x26])((string *)&loop_lock,this,pSVar16);
              statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                        (this,(string *)&loop_lock,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &storage,(char (*) [2])0x37e4df);
              ::std::__cxx11::string::~string((string *)&loop_lock);
              emitted = true;
              ::std::__cxx11::string::~string((string *)&storage);
            }
          }
        }
      }
      if (emitted != false) {
        statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
      }
      (*(this->super_Compiler)._vptr_Compiler[0x3b])(this);
      return;
    }
    uVar11 = *(uint *)((long)&local_1b0->self + lVar22);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar11].type ==
        TypeVariable) {
      pSVar16 = ParsedIR::get<spirv_cross::SPIRVariable>(local_1b8,uVar11);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar16->super_IVariant).field_0xc);
      bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar16,false);
      SVar20 = pSVar16->storage;
      if (SVar20 == StorageClassOutput) {
        bVar9 = is_legacy(this);
        if (!bVar9) {
          uVar10 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(pSVar16->super_IVariant).self.id,
                              DecorationLocation);
          bVar9 = location_is_framebuffer_fetch(this,uVar10);
          bVar8 = bVar8 && !bVar9;
        }
        SVar20 = pSVar16->storage;
      }
      if ((((SVar20 == StorageClassFunction) || (pSVar15->pointer != true)) ||
          ((SVar20 | StorageClassUniform) != StorageClassOutput)) ||
         (bVar9 = Compiler::interface_variable_exists_in_entry_point
                            (&this->super_Compiler,(pSVar16->super_IVariant).self.id),
         bVar8 != false || !bVar9)) {
        bVar8 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar16);
        if ((bVar8) &&
           (uVar10 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar16->super_IVariant).self.id,
                                DecorationBuiltIn), (this->options).vulkan_semantics == false)) {
          if ((emitted_base_instance == false) &&
             ((uVar10 == 0x1149 ||
              ((uVar10 == 0x2b & (this->options).vertex.support_nonzero_base_instance) != 0)))) {
            statement<char_const(&)[37]>(this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters")
            ;
            statement<char_const(&)[52]>
                      (this,(char (*) [52])"#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[38]>
                      (this,(char (*) [38])"uniform int SPIRV_Cross_BaseInstance;");
            statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
            emitted = true;
            pSVar18 = &wg_y;
            goto LAB_0024049c;
          }
          if (uVar10 == 0x114a) {
            statement<char_const(&)[38]>
                      (this,(char (*) [38])"#ifndef GL_ARB_shader_draw_parameters");
            statement<char_const(&)[55]>
                      (this,(char (*) [55])"#error GL_ARB_shader_draw_parameters is not supported.")
            ;
          }
          else {
            if (uVar10 != 0x1148) goto LAB_002404a2;
            statement<char_const(&)[37]>(this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters")
            ;
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[36]>(this,(char (*) [36])"uniform int SPIRV_Cross_BaseVertex;");
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
      }
      else {
        if (((((this->options).es == true) &&
             (EVar12 = Compiler::get_execution_model(&this->super_Compiler),
             EVar12 == ExecutionModelVertex)) && (pSVar16->storage == StorageClassInput)) &&
           ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 1)) {
          this_02 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&storage,
                     "OpenGL ES doesn\'t support array input variables in vertex shader.",
                     (allocator *)&wg_z);
          CompilerError::CompilerError(this_02,(string *)&storage);
          __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        emit_interface_block(this,pSVar16);
        pSVar18 = &wg_x;
LAB_0024049c:
        *(undefined1 *)*pSVar18 = 1;
      }
    }
LAB_002404a2:
    lVar22 = lVar22 + 4;
  } while( true );
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (position_invariant)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_or_type)
		{
			auto &id = ir.ids[id_];

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		for (auto type : physical_storage_non_block_pointer_types)
		{
			emit_buffer_reference_block(type, false);
		}

		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct && type.pointer &&
			    type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, true);
			}
		});

		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct &&
			    type.pointer && type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, false);
			}
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");

	declare_undefined_values();
}